

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Encode
          (LE_DeadReckoningParameter *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8DeadRecknoningAlgorithm);
  (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_LinearAcceleration,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  return;
}

Assistant:

void LE_DeadReckoningParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8DeadRecknoningAlgorithm
           << KDIS_STREAM m_LinearAcceleration
           << KDIS_STREAM m_AngularVelocity;
}